

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_reshape_before_binaryop(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  Layer *pLVar3;
  Layer *pLVar4;
  pointer ppLVar5;
  pointer pBVar6;
  bool bVar7;
  ulong uVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __position;
  long lVar9;
  int *piVar10;
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar11;
  int local_40;
  int local_3c;
  Layer *local_38;
  
  uVar11 = (long)(this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_3c = 0;
  do {
    if (uVar11 <= (ulong)(long)local_3c) {
      return 0;
    }
    bVar7 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[local_3c]->type,"Reshape");
    if ((((!bVar7) &&
         (pLVar3 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[local_3c], *(int *)&pLVar3[1]._vptr_Layer == 1))
        && (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 1)) &&
       (*(int *)&pLVar3[1].support_bf16_storage == 0)) {
      iVar1 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_40 = local_3c;
      while( true ) {
        local_40 = local_40 + 1;
        uVar8 = (ulong)local_40;
        if (uVar11 <= uVar8) break;
        bVar7 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar8]->type,"BinaryOp");
        if (!bVar7) {
          uVar8 = (ulong)local_40;
          pLVar4 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          piVar10 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((long)*(pointer *)
                      ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl + 8) - (long)piVar10 == 8) &&
             ((*piVar10 == iVar1 || (piVar10[1] == iVar1)))) break;
        }
      }
      if (uVar11 != uVar8) {
        local_38 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
        fprintf(_stderr,"eliminate_reshape_before_binaryop %s %s\n",(pLVar3->name)._M_dataplus._M_p,
                (local_38->name)._M_dataplus._M_p);
        iVar2 = *(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppLVar5 = (this->super_Net).layers.
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar10 = (ppLVar5[local_40]->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_start;
        if (*piVar10 == iVar1) {
          *(local_38->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar2;
          piVar10 = (ppLVar5[local_40]->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        if (piVar10[1] == iVar1) {
          *(int *)(*(long *)&(local_38->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data + 4) = iVar2;
        }
        lVar9 = (long)iVar2;
        pBVar6 = (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_38 = (Layer *)(lVar9 * 0x80);
        this_00 = &pBVar6[lVar9].consumers;
        __position = std::
                     __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start,
                                *(pointer *)
                                 ((long)&pBVar6[lVar9].consumers.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8),
                                &local_3c);
        std::vector<int,_std::allocator<int>_>::erase(this_00,(const_iterator)__position._M_current)
        ;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(((this->super_Net).blobs.
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start)->consumers).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)local_38),
                   &local_40);
        std::__cxx11::string::assign((char *)&pLVar3->type);
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_before_binaryop()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Reshape")
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[i];
        if (reshape->w != 1 || reshape->h != 1 || reshape->permute != 0)
            continue;

        // Reshape - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        fprintf(stderr, "eliminate_reshape_before_binaryop %s %s\n", reshape->name.c_str(), binaryop->name.c_str());

        int bottom_blob_index_final = reshape->bottoms[0];
        if (layers[j]->bottoms[0] == top_blob_index)
            binaryop->bottoms[0] = bottom_blob_index_final;
        if (layers[j]->bottoms[1] == top_blob_index)
            binaryop->bottoms[1] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumers.erase(std::find(blobs[bottom_blob_index_final].consumers.begin(), blobs[bottom_blob_index_final].consumers.end(), i));
        blobs[bottom_blob_index_final].consumers.push_back(j);
        reshape->type = "ncnnfused";
    }

    return 0;
}